

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void dummy_ImportCall(void)

{
  return;
}

Assistant:

Var JavascriptOperators::OP_NewAwaitObject(ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(NewAwaitObject);
        auto* awaitObject = DynamicObject::New(
            scriptContext->GetRecycler(),
            scriptContext->GetLibrary()->GetAwaitObjectType());
        return awaitObject;
        JIT_HELPER_END(NewAwaitObject);
    }